

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_byte_orderings(test_state *state)

{
  int iVar1;
  long in_RDI;
  int status;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  printf("-----------------------------------\n");
  printf("Checking no PP, LSB first, unsigned\n");
  printf("-----------------------------------\n");
  iVar1 = check_bps((test_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) = *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) | 8;
    iVar1 = check_bps((test_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar1 == 0) {
      printf("-----------------------------------\n");
      printf("Checking PP, LSB first, signed\n");
      printf("-----------------------------------\n");
      *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) = *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) | 1;
      iVar1 = check_bps((test_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
      ;
      if (iVar1 == 0) {
        *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) =
             *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) & 0xfffffffe;
        *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) = *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) | 4;
        printf("-----------------------------------\n");
        printf("Checking PP, MSB first, unsigned\n");
        printf("-----------------------------------\n");
        iVar1 = check_bps((test_state *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar1 == 0) {
          printf("-----------------------------------\n");
          printf("Checking PP, MSB first, signed\n");
          printf("-----------------------------------\n");
          *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) =
               *(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) | 1;
          iVar1 = check_bps((test_state *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          if (iVar1 == 0) {
            iVar1 = 0;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int check_byte_orderings(struct test_state *state)
{
    int status;

    printf("-----------------------------------\n");
    printf("Checking no PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_PREPROCESS;
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, signed\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_SIGNED;

    status = check_bps(state);
    if (status)
        return status;

    state->strm->flags &= ~AEC_DATA_SIGNED;
    state->strm->flags |= AEC_DATA_MSB;

    printf("-----------------------------------\n");
    printf("Checking PP, MSB first, unsigned\n");
    printf("-----------------------------------\n");
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, MSB first, signed\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_SIGNED;

    status = check_bps(state);
    if (status)
        return status;
    return 0;
}